

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::convert_etc1s_to_bc7_m5_alpha(void *pDst,endpoint *pEndpoints,selector *pSelector)

{
  uint32_t uVar1;
  uint uVar2;
  byte *pbVar3;
  long lVar4;
  long in_RDX;
  byte *in_RSI;
  ulong *in_RDI;
  uint32_t num_bits_1;
  uint32_t os_1;
  uint32_t s_1;
  uint32_t x_1;
  uint32_t y_1;
  uint32_t selector_trans;
  uint32_t output_bits;
  uint32_t output_bit_offset;
  etc1_g_to_bc7_m5a_conversion *pTable;
  uint32_t selector_range_table;
  uint32_t num_bits;
  uint32_t os;
  uint32_t s;
  uint32_t x;
  uint32_t y;
  uint32_t output_bits_1;
  uint32_t output_bit_offset_1;
  uint32_t output_low_selector;
  int block_colors [4];
  uint32_t r;
  uint32_t inten_table;
  uint32_t base_color_r;
  uint32_t high_selector;
  uint32_t low_selector;
  bc7_mode_5 *pDst_block;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  uint32_t in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  uint32_t in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint local_88;
  uint local_84;
  uint local_5c;
  uint local_58;
  uint local_4c;
  uint local_48 [5];
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  ulong *local_20;
  
  local_24 = (uint)*(byte *)(in_RDX + 8);
  local_28 = (uint)*(byte *)(in_RDX + 9);
  local_2c = (uint)*in_RSI;
  local_30 = (uint)in_RSI[4];
  local_20 = in_RDI;
  if (*(char *)(in_RDX + 10) == '\x01') {
    decoder_etc_block::get_block_color5_r
              ((color32 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
               (uint32_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    *local_20 = *local_20 & 0xfc03ffffffffffff | ((ulong)local_34 & 0xff) << 0x32;
    *local_20 = *local_20 & 0x3ffffffffffffff | (ulong)(local_34 & 0x3f) << 0x3a;
    local_20[1] = local_20[1] & 0xfffffffffffffffc | (ulong)(local_34 >> 6) & 3;
  }
  else if (*(char *)(in_RDX + 10) == '\x02') {
    decoder_etc_block::get_block_colors5_g
              ((int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (color32 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff64);
    *local_20 = *local_20 & 0xfc03ffffffffffff | ((long)(int)local_48[local_24] & 0xffU) << 0x32;
    *local_20 = *local_20 & 0x3ffffffffffffff | (long)(int)(local_48[local_28] & 0x3f) << 0x3a;
    local_20[1] = local_20[1] & 0xfffffffffffffffc | (long)((int)local_48[local_28] >> 6) & 3U;
    local_4c = 0;
    for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
      for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
        uVar1 = selector::get_selector
                          ((selector *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                           ,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff64 = local_4c;
        if (uVar1 != local_24) {
          in_stack_ffffffffffffff64 = local_4c ^ 3;
        }
        if ((local_5c == 0 && local_58 == 0) && ((in_stack_ffffffffffffff64 & 2) != 0)) {
          *local_20 = *local_20 & 0xfc03ffffffffffff |
                      ((long)(int)local_48[local_28] & 0xffU) << 0x32;
          *local_20 = *local_20 & 0x3ffffffffffffff | (long)(int)(local_48[local_24] & 0x3f) << 0x3a
          ;
          local_20[1] = local_20[1] & 0xfffffffffffffffc | (long)((int)local_48[local_24] >> 6) & 3U
          ;
          local_4c = 3;
        }
      }
    }
    set_block_bits((uint8_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  }
  else {
    lVar4 = (ulong)(local_30 * 0xc0 + local_2c * 6 +
                   *(int *)(g_etc1_to_bc7_m5a_selector_range_index +
                           (ulong)local_28 * 4 + (ulong)local_24 * 0x10)) * 3;
    pbVar3 = g_etc1_g_to_bc7_m5a + lVar4;
    *in_RDI = *in_RDI & 0xfc03ffffffffffff | (ulong)*pbVar3 << 0x32;
    *in_RDI = *in_RDI & 0x3ffffffffffffff |
              (long)(int)((byte)g_etc1_g_to_bc7_m5a[lVar4 + 1] & 0x3f) << 0x3a;
    in_RDI[1] = in_RDI[1] & 0xfffffffffffffffc |
                (long)((int)(uint)(byte)g_etc1_g_to_bc7_m5a[lVar4 + 1] >> 6);
    local_84 = (uint)(byte)g_etc1_g_to_bc7_m5a[lVar4 + 2];
    for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
      for (in_stack_ffffffffffffff74 = 0; in_stack_ffffffffffffff74 < 4;
          in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + 1) {
        in_stack_ffffffffffffff70 =
             selector::get_selector
                       ((selector *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
        uVar2 = local_84 >> ((byte)(in_stack_ffffffffffffff70 << 1) & 0x1f);
        in_stack_ffffffffffffff6c = uVar2 & 3;
        in_stack_ffffffffffffff68 = 2;
        if (in_stack_ffffffffffffff74 == 0 && local_88 == 0) {
          if ((uVar2 & 2) != 0) {
            *local_20 = *local_20 & 0xfc03ffffffffffff |
                        (ulong)(byte)g_etc1_g_to_bc7_m5a[lVar4 + 1] << 0x32;
            *local_20 = *local_20 & 0x3ffffffffffffff | (long)(int)(*pbVar3 & 0x3f) << 0x3a;
            local_20[1] = local_20[1] & 0xfffffffffffffffc | (long)((int)(uint)*pbVar3 >> 6);
            local_84 = local_84 ^ 0xff;
            in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c ^ 3;
          }
          in_stack_ffffffffffffff68 = 1;
        }
      }
    }
    set_block_bits((uint8_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  }
  return;
}

Assistant:

static void convert_etc1s_to_bc7_m5_alpha(void* pDst, const endpoint* pEndpoints, const selector* pSelector)
	{
		bc7_mode_5* pDst_block = static_cast<bc7_mode_5*>(pDst);

		const uint32_t low_selector = pSelector->m_lo_selector;
		const uint32_t high_selector = pSelector->m_hi_selector;

		const uint32_t base_color_r = pEndpoints->m_color5.r;
		const uint32_t inten_table = pEndpoints->m_inten5;

		if (pSelector->m_num_unique_selectors == 1)
		{
			uint32_t r;
			decoder_etc_block::get_block_color5_r(pEndpoints->m_color5, inten_table, low_selector, r);

			pDst_block->m_lo.m_a0 = r;
			pDst_block->m_lo.m_a1_0 = r & 63;
			pDst_block->m_hi.m_a1_1 = r >> 6;
					  
			return;
		}
		else if (pSelector->m_num_unique_selectors == 2)
		{
			// Only one or two unique selectors, so just switch to block truncation coding (BTC) to avoid quality issues on extreme blocks.
			int block_colors[4];

			decoder_etc_block::get_block_colors5_g(block_colors, pEndpoints->m_color5, inten_table);

			pDst_block->m_lo.m_a0 = block_colors[low_selector];
			pDst_block->m_lo.m_a1_0 = block_colors[high_selector] & 63;
			pDst_block->m_hi.m_a1_1 = block_colors[high_selector] >> 6;

			uint32_t output_low_selector = 0, output_bit_offset = 0, output_bits = 0;

			for (uint32_t y = 0; y < 4; y++)
			{
				for (uint32_t x = 0; x < 4; x++)
				{
					const uint32_t s = pSelector->get_selector(x, y);
					uint32_t os = (s == low_selector) ? output_low_selector : (3 ^ output_low_selector);

					uint32_t num_bits = 2;

					if ((x | y) == 0)
					{
						if (os & 2)
						{
							pDst_block->m_lo.m_a0 = block_colors[high_selector];
							pDst_block->m_lo.m_a1_0 = block_colors[low_selector] & 63;
							pDst_block->m_hi.m_a1_1 = block_colors[low_selector] >> 6;

							output_low_selector = 3;
							os = 0;
						}

						num_bits = 1;
					}

					output_bits |= (os << output_bit_offset);
					output_bit_offset += num_bits;
				}
			}

			set_block_bits((uint8_t*)pDst, output_bits, 31, 97);
			return;
		}

		const uint32_t selector_range_table = g_etc1_to_bc7_m5a_selector_range_index[low_selector][high_selector];
						
		const etc1_g_to_bc7_m5a_conversion* pTable = &g_etc1_g_to_bc7_m5a[inten_table * (32 * NUM_ETC1_TO_BC7_M5A_SELECTOR_RANGES) + base_color_r * NUM_ETC1_TO_BC7_M5A_SELECTOR_RANGES + selector_range_table];

		pDst_block->m_lo.m_a0 = pTable->m_lo;
		pDst_block->m_lo.m_a1_0 = pTable->m_hi & 63;
		pDst_block->m_hi.m_a1_1 = pTable->m_hi >> 6;

		uint32_t output_bit_offset = 0, output_bits = 0, selector_trans = pTable->m_trans;

		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				const uint32_t s = pSelector->get_selector(x, y);
				uint32_t os = (selector_trans >> (s * 2)) & 3;

				uint32_t num_bits = 2;

				if ((x | y) == 0)
				{
					if (os & 2)
					{
						pDst_block->m_lo.m_a0 = pTable->m_hi;
						pDst_block->m_lo.m_a1_0 = pTable->m_lo & 63;
						pDst_block->m_hi.m_a1_1 = pTable->m_lo >> 6;

						selector_trans ^= 0xFF;
						os ^= 3;
					}

					num_bits = 1;
				}

				output_bits |= (os << output_bit_offset);
				output_bit_offset += num_bits;
			}
		}

		set_block_bits((uint8_t*)pDst, output_bits, 31, 97);
	}